

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O2

void __thiscall Timidity::Renderer::adjust_pitchbend(Renderer *this,int chan)

{
  int v;
  long lVar1;
  long lVar2;
  bool bVar3;
  
  v = this->voices;
  lVar2 = (long)v;
  lVar1 = lVar2 * 0x170 + -0x16f;
  while( true ) {
    v = v + -1;
    bVar3 = lVar2 == 0;
    lVar2 = lVar2 + -1;
    if (bVar3) break;
    if (((*(byte *)((long)this->voice + lVar1 + -1) & 1) != 0) &&
       ((uint)(&this->voice->status)[lVar1] == chan)) {
      recompute_freq(this,v);
    }
    lVar1 = lVar1 + -0x170;
  }
  return;
}

Assistant:

void Renderer::adjust_pitchbend(int chan)
{
	int i = voices;
	while (i--)
	{
		if ((voice[i].status & VOICE_RUNNING) && voice[i].channel == chan)
		{
			recompute_freq(i);
		}
	}
}